

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

uint16_t __thiscall BaseSocketImpl::GetSocketPort(BaseSocketImpl *this)

{
  int iVar1;
  int iVar2;
  uint16_t unaff_BP;
  allocator<char> local_f5;
  socklen_t addLen;
  string servInfoPeer;
  string caAddrPeer;
  string local_b0;
  sockaddr_storage addrPe;
  
  addLen = 0x80;
  iVar1 = getsockname(this->m_fSock,(sockaddr *)&addrPe,&addLen);
  if (iVar1 == 0) {
    caAddrPeer._M_dataplus._M_p = (pointer)&caAddrPeer.field_2;
    std::__cxx11::string::_M_construct((ulong)&caAddrPeer,'/');
    servInfoPeer._M_dataplus._M_p = (pointer)&servInfoPeer.field_2;
    std::__cxx11::string::_M_construct((ulong)&servInfoPeer,' ');
    iVar1 = getnameinfo((sockaddr *)&addrPe,0x80,caAddrPeer._M_dataplus._M_p,0x2e,
                        servInfoPeer._M_dataplus._M_p,0x20,3);
    if (iVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,servInfoPeer._M_dataplus._M_p,&local_f5);
      iVar2 = std::__cxx11::stoi(&local_b0,(size_t *)0x0,10);
      unaff_BP = (uint16_t)iVar2;
      std::__cxx11::string::~string((string *)&local_b0);
    }
    std::__cxx11::string::~string((string *)&servInfoPeer);
    std::__cxx11::string::~string((string *)&caAddrPeer);
    if (iVar1 == 0) {
      return unaff_BP;
    }
  }
  return 0;
}

Assistant:

uint16_t BaseSocketImpl::GetSocketPort()
{
    struct sockaddr_storage addrPe;
    socklen_t addLen = sizeof(addrPe);
    if (::getsockname(m_fSock, reinterpret_cast<struct sockaddr*>(&addrPe), &addLen) == 0)  // Get our IP where the connection was established
    {
        string caAddrPeer(INET6_ADDRSTRLEN + 1, 0);
        string servInfoPeer(NI_MAXSERV, 0);
        if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addrPe), sizeof(struct sockaddr_storage), &caAddrPeer[0], INET6_ADDRSTRLEN, &servInfoPeer[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
        {
            return static_cast<uint16_t>(stoi(&servInfoPeer[0]));
        }
    }

    return 0;
}